

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldStateTest_MergeFromMapDirty_Test::
~MapFieldStateTest_MergeFromMapDirty_Test(MapFieldStateTest_MergeFromMapDirty_Test *this)

{
  MapFieldBase **this_00;
  
  this_00 = &this[-1].super_MapFieldStateTest.map_field_base_;
  this[-1].super_MapFieldStateTest.map_field_base_ =
       (MapFieldBase *)&PTR__MapFieldStateTest_018fbe30;
  (this->super_MapFieldStateTest).
  super_TestWithParam<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__MapFieldStateTest_018fbe70;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                  *)&(this->super_MapFieldStateTest).
                     super_TestWithParam<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>
                     .
                     super_WithParamInterface<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>
                );
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              &(this->super_MapFieldStateTest).
               super_TestWithParam<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>
               .super_Test.gtest_flag_saver_);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x40);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, MergeFromMapDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeMapDirty(other.get());

  map_field_->MergeFrom(*other);

  if (state_ != MAP_DIRTY) {
    Expect(map_field_.get(), MAP_DIRTY, 1, 1);
  } else {
    Expect(map_field_.get(), MAP_DIRTY, 1, 0);
  }

  Expect(other.get(), MAP_DIRTY, 1, 0);
}